

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O2

bool __thiscall
ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::validate_input<false>
          (Ruckig<0UL,_ruckig::StandardVector,_false> *this,
          InputParameter<0UL,_ruckig::StandardVector> *input,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  pointer pvVar1;
  pointer pvVar2;
  bool bVar3;
  
  bVar3 = InputParameter<0UL,_ruckig::StandardVector>::validate<false>
                    (input,check_current_state_within_limits,check_target_state_within_limits);
  if (bVar3) {
    pvVar1 = (input->intermediate_positions).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (input->intermediate_positions).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((pvVar1 == pvVar2) || (input->control_interface != Position)) ||
       ((ulong)(((long)pvVar2 - (long)pvVar1) / 0x18) <= this->max_number_of_waypoints)) {
      return input->duration_discretization == Continuous || 0.0 < this->delta_time;
    }
  }
  return false;
}

Assistant:

bool validate_input(const InputParameter<DOFs, CustomVector>& input, bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        if (!input.template validate<throw_validation_error>(check_current_state_within_limits, check_target_state_within_limits)) {
            return false;
        }

        if (!input.intermediate_positions.empty() && input.control_interface == ControlInterface::Position) {
            if (input.intermediate_positions.size() > max_number_of_waypoints) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("The number of intermediate positions " + std::to_string(input.intermediate_positions.size()) + " exceeds the maximum number of waypoints " + std::to_string(max_number_of_waypoints) + ".");
                }
                return false;
            }
        }

        if (delta_time <= 0.0 && input.duration_discretization != DurationDiscretization::Continuous) {
            if constexpr (throw_validation_error) {
                throw RuckigError("delta time (control rate) parameter " + std::to_string(delta_time) + " should be larger than zero.");
            }
            return false;
        }

        return true;
    }